

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StartThreadRazorAHRSx(RAZORAHRS *pRazorAHRS)

{
  int iVar1;
  int local_1c;
  int id;
  RAZORAHRS *pRazorAHRS_local;
  
  local_1c = 0;
  do {
    if ((RAZORAHRS *)addrsRazorAHRS[local_1c] == pRazorAHRS) {
      resRazorAHRS[local_1c] = 1;
      bExitRazorAHRS[local_1c] = 0;
      memset(razorahrsdataRazorAHRS,0,0x60);
      InitCriticalSection(RazorAHRSCS + local_1c);
      iVar1 = CreateDefaultThread(RazorAHRSThread,pRazorAHRS,RazorAHRSThreadId + local_1c);
      return iVar1;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadRazorAHRSx(RAZORAHRS* pRazorAHRS)
{
	int id = 0;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resRazorAHRS[id] = EXIT_FAILURE;
	bExitRazorAHRS[id] = FALSE;
	memset(&razorahrsdataRazorAHRS, 0, sizeof(RAZORAHRSDATA));
	InitCriticalSection(&RazorAHRSCS[id]);
	return CreateDefaultThread(RazorAHRSThread, (void*)pRazorAHRS, &RazorAHRSThreadId[id]);
}